

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O0

void __thiscall
cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile
          (ClassFactoredSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  istream *piVar4;
  char *pcVar5;
  Dict *pDVar6;
  uint *puVar7;
  string *psVar8;
  reference pvVar9;
  ulong uVar10;
  size_type sVar11;
  reference this_00;
  string *in_RSI;
  long in_RDI;
  reference rVar12;
  bool sc;
  uint i;
  int scs;
  value_type *clusterwords;
  uint word;
  uint c;
  uint endw;
  uint startw;
  uint endc;
  uint startc;
  uint len;
  string line;
  int wc;
  ifstream in;
  value_type_conflict1 *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  size_type in_stack_fffffffffffffc48;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc50;
  size_type in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  byte bVar13;
  string *in_stack_fffffffffffffc90;
  Dict *in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffcc7;
  char *in_stack_fffffffffffffcc8;
  undefined6 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  reference local_2e0;
  undefined1 local_2c9;
  uint local_2c8;
  int local_2c4;
  reference local_2c0;
  undefined4 local_2b4;
  string local_2b0 [36];
  uint local_28c;
  string local_288 [32];
  uint local_268;
  uint local_264;
  uint local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  string local_250 [32];
  int local_230;
  long local_220 [66];
  string *local_10;
  
  local_10 = in_RSI;
  poVar3 = std::operator<<((ostream *)&std::cerr,"Reading clusters from ");
  poVar3 = std::operator<<(poVar3,local_10);
  std::operator<<(poVar3," ...\n");
  std::ifstream::ifstream(local_220,local_10,8);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (!bVar1) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,0x61,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  local_230 = 0;
  std::__cxx11::string::string(local_250);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,local_250);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)(in_RDI + 0x88));
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,
                          CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                 (size_type)in_stack_fffffffffffffcc8,(bool)in_stack_fffffffffffffcc7);
      local_2c4 = 0;
      local_2c8 = 0;
      while( true ) {
        uVar10 = (ulong)local_2c8;
        sVar11 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)(in_RDI + 0x88));
        if (sVar11 <= uVar10) break;
        this_00 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x88),(ulong)local_2c8);
        sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
        bVar13 = sVar11 < 2;
        if ((bool)bVar13) {
          local_2c4 = local_2c4 + 1;
        }
        local_2c9 = bVar13;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        local_2e0 = rVar12;
        std::_Bit_reference::operator=(&local_2e0,(bool)(bVar13 & 1));
        local_2c8 = local_2c8 + 1;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"Read ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_230);
      poVar3 = std::operator<<(poVar3," words in ");
      uVar2 = Dict::size((Dict *)0x4e2887);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3," clusters (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2c4);
      std::operator<<(poVar3," singleton clusters)\n");
      std::__cxx11::string::~string(local_250);
      std::ifstream::~ifstream(local_220);
      return;
    }
    local_230 = local_230 + 1;
    local_254 = std::__cxx11::string::size();
    local_258 = 0;
    while( true ) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_250);
      bVar1 = is_ws(*pcVar5);
      if (!bVar1 || local_254 <= local_258) break;
      local_258 = local_258 + 1;
    }
    local_25c = local_258;
    while( true ) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_250);
      bVar1 = not_ws(*pcVar5);
      if (!bVar1 || local_254 <= local_25c) break;
      local_25c = local_25c + 1;
    }
    local_260 = local_25c;
    while( true ) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_250);
      in_stack_fffffffffffffcd7 = is_ws(*pcVar5);
      in_stack_fffffffffffffcd6 = (bool)in_stack_fffffffffffffcd7 && local_260 < local_254;
      if (!(bool)in_stack_fffffffffffffcd7 || local_260 >= local_254) break;
      local_260 = local_260 + 1;
    }
    local_264 = local_260;
    while( true ) {
      in_stack_fffffffffffffcc8 = (char *)std::__cxx11::string::operator[]((ulong)local_250);
      in_stack_fffffffffffffcc7 = not_ws(*in_stack_fffffffffffffcc8);
      if (!(bool)in_stack_fffffffffffffcc7 || local_254 <= local_264) break;
      local_264 = local_264 + 1;
    }
    if (local_25c <= local_258) {
      __assert_fail("endc > startc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                    ,0x6f,
                    "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                   );
    }
    if (local_260 <= local_25c) {
      __assert_fail("startw > endc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                    ,0x70,
                    "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                   );
    }
    if (local_264 <= local_260) break;
    std::__cxx11::string::substr((ulong)local_288,(ulong)local_250);
    uVar2 = Dict::Convert(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    std::__cxx11::string::~string(local_288);
    local_268 = uVar2;
    std::__cxx11::string::substr((ulong)local_2b0,(ulong)local_250);
    uVar2 = Dict::Convert(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    std::__cxx11::string::~string(local_2b0);
    in_stack_fffffffffffffc98 = (Dict *)(ulong)uVar2;
    local_28c = uVar2;
    pDVar6 = (Dict *)std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58));
    if (pDVar6 <= in_stack_fffffffffffffc98) {
      local_2b4 = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                 in_stack_fffffffffffffc58,(value_type_conflict *)in_stack_fffffffffffffc50);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
    }
    uVar2 = local_268;
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),
                                (ulong)local_28c);
    *puVar7 = uVar2;
    in_stack_fffffffffffffc90 = (string *)(ulong)local_268;
    psVar8 = (string *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)(in_RDI + 0x88));
    if (psVar8 <= in_stack_fffffffffffffc90) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
    local_2c0 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x88),(ulong)local_268);
    sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_2c0);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x70),
                        (ulong)local_28c);
    *pvVar9 = (value_type)sVar11;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               in_stack_fffffffffffffc38);
  }
  __assert_fail("endw > startw",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                ,0x71,
                "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
               );
}

Assistant:

void ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  while(getline(in, line)) {
    ++wc;
    const unsigned len = line.size();
    unsigned startc = 0;
    while (is_ws(line[startc]) && startc < len) { ++startc; }
    unsigned endc = startc;
    while (not_ws(line[endc]) && endc < len) { ++endc; }
    unsigned startw = endc;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endc > startc);
    assert(startw > endc);
    assert(endw > startw);
    unsigned c = cdict.Convert(line.substr(startc, endc - startc));
    unsigned word = word_dict->Convert(line.substr(startw, endw - startw));
    if (word >= widx2cidx.size()) {
      widx2cidx.resize(word + 1, -1);
      widx2cwidx.resize(word + 1);
    }
    widx2cidx[word] = c;
    if (c >= cidx2words.size()) cidx2words.resize(c + 1);
    auto& clusterwords = cidx2words[c];
    widx2cwidx[word] = clusterwords.size();
    clusterwords.push_back(word);
  }
  singleton_cluster.resize(cidx2words.size());
  int scs = 0;
  for (unsigned i = 0; i < cidx2words.size(); ++i) {
    bool sc = cidx2words[i].size() <= 1;
    if (sc) scs++;
    singleton_cluster[i] = sc;
  }
  cerr << "Read " << wc << " words in " << cdict.size() << " clusters (" << scs << " singleton clusters)\n";
}